

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

int ImGui::CalcTypematicRepeatAmount(float t0,float t1,float repeat_delay,float repeat_rate)

{
  int local_2c;
  int local_28;
  bool local_21;
  int count;
  int count_t1;
  int count_t0;
  float repeat_rate_local;
  float repeat_delay_local;
  float t1_local;
  float t0_local;
  uint local_4;
  
  if ((t1 != 0.0) || (NAN(t1))) {
    if (t0 < t1) {
      if (0.0 < repeat_rate) {
        if (repeat_delay <= t0) {
          local_28 = (int)((t0 - repeat_delay) / repeat_rate);
        }
        else {
          local_28 = -1;
        }
        if (repeat_delay <= t1) {
          local_2c = (int)((t1 - repeat_delay) / repeat_rate);
        }
        else {
          local_2c = -1;
        }
        local_4 = local_2c - local_28;
      }
      else {
        local_21 = t0 < repeat_delay && repeat_delay <= t1;
        local_4 = (uint)local_21;
      }
    }
    else {
      local_4 = 0;
    }
  }
  else {
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int ImGui::CalcTypematicRepeatAmount(float t0, float t1, float repeat_delay, float repeat_rate)
{
    if (t1 == 0.0f)
        return 1;
    if (t0 >= t1)
        return 0;
    if (repeat_rate <= 0.0f)
        return (t0 < repeat_delay) && (t1 >= repeat_delay);
    const int count_t0 = (t0 < repeat_delay) ? -1 : (int)((t0 - repeat_delay) / repeat_rate);
    const int count_t1 = (t1 < repeat_delay) ? -1 : (int)((t1 - repeat_delay) / repeat_rate);
    const int count = count_t1 - count_t0;
    return count;
}